

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O1

bool __thiscall rcg::Buffer::getImagePresent(Buffer *this,uint32_t part)

{
  void *pvVar1;
  INFO_DATATYPE type;
  unsigned_long ret;
  size_t size;
  undefined1 local_24 [4];
  size_t local_20 [2];
  
  if (this->multipart == true) {
    pvVar1 = Stream::getHandle(this->parent);
    local_20[0] = 0;
    local_20[1] = 8;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar1 != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferPartInfo)
                (pvVar1,this->buffer,part,2,(INFO_DATATYPE *)local_24,local_20,local_20 + 1);
    }
    local_24[0] = local_20[0] - 1 < 9;
  }
  else if ((this->payload_type != 4) ||
          (local_24[0] = 1,
          (this->nodemap).super___shared_ptr<GenApi_3_4::CNodeMapRef,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (element_type *)0x0)) {
    pvVar1 = Stream::getHandle(this->parent);
    local_24[0] = 0;
    local_20[0] = 1;
    if (this->buffer != (BUFFER_HANDLE)0x0 && pvVar1 != (void *)0x0) {
      (*((this->gentl).super___shared_ptr<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->DSGetBufferInfo)
                (pvVar1,this->buffer,0x11,(INFO_DATATYPE *)(local_20 + 1),local_24,local_20);
    }
  }
  return (bool)local_24[0];
}

Assistant:

bool Buffer::getImagePresent(uint32_t part) const
{
  if (multipart)
  {
    size_t type=getBufferPartValue<size_t>(gentl, parent->getHandle(), buffer, part,
                                           GenTL::BUFFER_PART_INFO_DATA_TYPE);

    bool ret;

    switch (type)
    {
      case PART_DATATYPE_2D_IMAGE:
      case PART_DATATYPE_2D_PLANE_BIPLANAR:
      case PART_DATATYPE_2D_PLANE_TRIPLANAR:
      case PART_DATATYPE_2D_PLANE_QUADPLANAR:
      case PART_DATATYPE_3D_IMAGE:
      case PART_DATATYPE_3D_PLANE_BIPLANAR:
      case PART_DATATYPE_3D_PLANE_TRIPLANAR:
      case PART_DATATYPE_3D_PLANE_QUADPLANAR:
      case PART_DATATYPE_CONFIDENCE_MAP:
        ret=true;
        break;

      default:
        ret=false;
        break;
    }

    return ret;
  }
  else
  {
    if (payload_type == PAYLOAD_TYPE_CHUNK_DATA && nodemap)
    {
      return true;
    }

    return getBufferBool(gentl, parent->getHandle(), buffer, GenTL::BUFFER_INFO_IMAGEPRESENT);
  }
}